

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O2

void TestServerConnector::VerifyNotificationResult(string *raw_response)

{
  code *pcVar1;
  char extraout_AL;
  double __x;
  ExpressionDecomposer local_d4;
  Result local_d0;
  ulong local_b0;
  ResultBuilder DOCTEST_RB;
  
  doctest::String::String((String *)&local_d0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x28,"raw_response.empty()","",(String *)&local_d0);
  doctest::String::~String((String *)&local_d0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d4,DT_REQUIRE);
  local_b0 = (ulong)(raw_response->_M_string_length == 0) | (ulong)local_d4.m_at << 0x20;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_d0,(Expression_lhs *)&local_b0);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_d0);
  doctest::String::~String(&local_d0.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  return;
}

Assistant:

static void VerifyNotificationResult(string &raw_response) { REQUIRE(raw_response.empty()); }